

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

void __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::
KinDynComputationsPrivateAttributes(KinDynComputationsPrivateAttributes *this)

{
  SpatialMotionVector ret;
  Twist local_98 [48];
  SpatialMotionVector local_68;
  
  iDynTree::Model::Model(&this->m_robot_model);
  iDynTree::Traversal::Traversal(&this->m_traversal);
  iDynTree::LinkTraversalsCache::LinkTraversalsCache(&this->m_traversalCache);
  iDynTree::FreeFloatingPos::FreeFloatingPos(&this->m_pos);
  iDynTree::FreeFloatingVel::FreeFloatingVel(&this->m_vel);
  iDynTree::Twist::Twist(&this->m_baseVelSetViaRobotState);
  iDynTree::LinkPositions::LinkPositions(&this->m_linkPos,0);
  iDynTree::LinkVelArray::LinkVelArray(&this->m_linkVel,0);
  iDynTree::LinkInertias::LinkInertias(&this->m_linkCRBIs,0);
  iDynTree::FreeFloatingGeneralizedTorques::FreeFloatingGeneralizedTorques
            (&this->m_generalizedForcesContainer);
  iDynTree::FreeFloatingMassMatrix::FreeFloatingMassMatrix(&this->m_rawMassMatrix,0);
  *(undefined8 *)&(this->m_totalMomentum).field_0x28 = 0;
  *(undefined8 *)&(this->m_totalMomentum).field_0x30 = 0;
  *(undefined8 *)&(this->m_totalMomentum).field_0x18 = 0;
  *(undefined8 *)&(this->m_totalMomentum).field_0x20 = 0;
  *(undefined8 *)&(this->m_totalMomentum).field_0x8 = 0;
  *(undefined8 *)&(this->m_totalMomentum).field_0x10 = 0;
  *(undefined ***)&this->m_totalMomentum = &PTR__SpatialForceVector_0011acd0;
  iDynTree::MatrixDynSize::MatrixDynSize(&this->m_jacBuffer);
  (this->m_baseBiasAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
  .angularVec3.super_Vector3.m_data[1] = 0.0;
  (this->m_baseBiasAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
  .angularVec3.super_Vector3.m_data[2] = 0.0;
  (this->m_baseBiasAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
  .linearVec3.super_Vector3.m_data[2] = 0.0;
  (this->m_baseBiasAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
  .angularVec3.super_Vector3.m_data[0] = 0.0;
  (this->m_baseBiasAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
  .linearVec3.super_Vector3.m_data[0] = 0.0;
  (this->m_baseBiasAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>
  .linearVec3.super_Vector3.m_data[1] = 0.0;
  iDynTree::LinkAccArray::LinkAccArray(&this->m_linkBiasAcc,0);
  (this->m_baseAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
  angularVec3.super_Vector3.m_data[1] = 0.0;
  (this->m_baseAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
  angularVec3.super_Vector3.m_data[2] = 0.0;
  (this->m_baseAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
  linearVec3.super_Vector3.m_data[2] = 0.0;
  (this->m_baseAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
  angularVec3.super_Vector3.m_data[0] = 0.0;
  (this->m_baseAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
  linearVec3.super_Vector3.m_data[0] = 0.0;
  (this->m_baseAcc).super_SpatialMotionVector.super_SpatialVector<iDynTree::SpatialMotionVector>.
  linearVec3.super_Vector3.m_data[1] = 0.0;
  iDynTree::FreeFloatingAcc::FreeFloatingAcc(&this->m_generalizedAccs);
  iDynTree::LinkAccArray::LinkAccArray(&this->m_linkAccs,0);
  (this->m_invDynBaseAcc).super_SpatialMotionVector.
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] = 0.0;
  (this->m_invDynBaseAcc).super_SpatialMotionVector.
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] = 0.0;
  (this->m_invDynBaseAcc).super_SpatialMotionVector.
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] = 0.0;
  (this->m_invDynBaseAcc).super_SpatialMotionVector.
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] = 0.0;
  (this->m_invDynBaseAcc).super_SpatialMotionVector.
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] = 0.0;
  (this->m_invDynBaseAcc).super_SpatialMotionVector.
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] = 0.0;
  iDynTree::FreeFloatingAcc::FreeFloatingAcc(&this->m_invDynGeneralizedProperAccs);
  iDynTree::LinkAccArray::LinkAccArray(&this->m_invDynLinkProperAccs,0);
  iDynTree::LinkWrenches::LinkWrenches(&this->m_invDynNetExtWrenches,0);
  iDynTree::LinkWrenches::LinkWrenches(&this->m_invDynInternalWrenches,0);
  iDynTree::FreeFloatingVel::FreeFloatingVel(&this->m_invDynZeroVel);
  iDynTree::LinkVelArray::LinkVelArray(&this->m_invDynZeroLinkVel,0);
  iDynTree::LinkAccArray::LinkAccArray(&this->m_invDynZeroLinkProperAcc,0);
  this->m_isModelValid = false;
  this->m_frameVelRepr = MIXED_REPRESENTATION;
  this->m_isFwdKinematicsUpdated = false;
  this->m_isRawMassMatrixUpdated = false;
  this->m_areBiasAccelerationsUpdated = false;
  local_68.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] =
       0.0;
  local_68.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] =
       0.0;
  local_68.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       0.0;
  local_68.super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] =
       0.0;
  local_68.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       0.0;
  local_68.super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       0.0;
  iDynTree::Twist::Twist(local_98,&local_68);
  iDynTree::Twist::operator=(&this->m_baseVelSetViaRobotState,local_98);
  return;
}

Assistant:

KinDynComputationsPrivateAttributes()
    {
        m_isModelValid = false;
        m_frameVelRepr = MIXED_REPRESENTATION;
        m_isFwdKinematicsUpdated = false;
        m_isRawMassMatrixUpdated = false;
        m_areBiasAccelerationsUpdated = false;
        m_baseVelSetViaRobotState = iDynTree::Twist::Zero();
    }